

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexWriter.cpp
# Opt level: O2

int __thiscall
Ptex::v2_2::PtexWriterBase::readBlock(PtexWriterBase *this,FILE *fp,void *data,int size)

{
  size_t sVar1;
  allocator<char> local_39;
  string local_38;
  
  sVar1 = fread(data,(long)size,1,(FILE *)fp);
  if (sVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"PtexWriter error: temp file read failed",&local_39);
    setError(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    size = 0;
  }
  return size;
}

Assistant:

int PtexWriterBase::readBlock(FILE* fp, void* data, int size)
{
    if (!fread(data, size, 1, fp)) {
        setError("PtexWriter error: temp file read failed");
        return 0;
    }
    return size;
}